

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_iTXt(ucvector *out,uint compress,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  size_t sVar1;
  long lVar2;
  uchar *__src;
  uchar *chunk_00;
  uint uVar3;
  size_t insize;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  char *orig_2;
  size_t __n;
  long lVar8;
  int iVar10;
  size_t __n_00;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  size_t local_68;
  uchar *local_60;
  size_t local_58;
  char *local_50;
  uchar *local_48;
  uchar *local_40;
  char *local_38;
  long lVar9;
  
  local_40 = (uchar *)0x0;
  local_60 = (uchar *)0x0;
  local_68 = 0;
  insize = 0xffffffffffffffff;
  do {
    lVar8 = insize + 1;
    insize = insize + 1;
  } while (textstring[lVar8] != '\0');
  sVar1 = 0;
  do {
    sVar7 = sVar1;
    sVar1 = sVar7 + 1;
  } while (keyword[sVar7] != '\0');
  iVar10 = -2 - (int)sVar1;
  __n_00 = 0xffffffffffffffff;
  lVar8 = sVar7 + 0xb;
  do {
    lVar9 = lVar8;
    lVar8 = lVar9 + 1;
    iVar10 = iVar10 + -1;
    lVar6 = __n_00 + 1;
    __n_00 = __n_00 + 1;
  } while (langtag[lVar6] != '\0');
  __n = 0xffffffffffffffff;
  lVar6 = lVar8;
  do {
    lVar5 = lVar6;
    iVar10 = iVar10 + -1;
    lVar6 = lVar5 + 1;
    lVar2 = __n + 1;
    __n = __n + 1;
  } while (transkey[lVar2] != '\0');
  uVar3 = 0x59;
  if (0xffffffffffffffb0 < sVar7 - 0x50) {
    local_58 = sVar7;
    local_50 = keyword;
    local_48 = (uchar *)textstring;
    local_38 = langtag;
    if (compress == 0) {
      uVar3 = 0;
    }
    else if (zlibsettings->custom_zlib ==
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
            ) {
      uVar3 = lodepng_zlib_compress(&local_60,&local_68,(uchar *)textstring,insize,zlibsettings);
    }
    else {
      uVar3 = (*zlibsettings->custom_zlib)
                        (&local_60,&local_68,(uchar *)textstring,insize,zlibsettings);
    }
    if (uVar3 == 0) {
      iVar4 = (int)insize;
      if (compress != 0) {
        iVar4 = (int)local_68;
      }
      uVar3 = lodepng_chunk_init(&local_40,out,iVar4 - iVar10,"iTXt");
    }
    chunk_00 = local_40;
    if (uVar3 == 0) {
      if (sVar1 != 1) {
        memcpy(local_40 + 8,local_50,local_58);
      }
      chunk_00[sVar7 + 8] = '\0';
      chunk_00[sVar7 + 9] = compress != 0;
      chunk_00[sVar7 + 10] = '\0';
      if (__n_00 != 0) {
        memcpy(chunk_00 + sVar7 + 0xb,local_38,__n_00);
      }
      chunk_00[lVar9] = '\0';
      if (__n != 0) {
        memcpy(chunk_00 + lVar8,transkey,__n);
      }
      chunk_00[lVar5] = '\0';
      __src = local_48;
      if (compress != 0) {
        insize = local_68;
        __src = local_60;
      }
      if (insize != 0) {
        memcpy(chunk_00 + lVar6,__src,insize);
      }
      lodepng_chunk_generate_crc(chunk_00);
    }
    free(local_60);
  }
  return uVar3;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compress, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword), langsize = lodepng_strlen(langtag), transsize = lodepng_strlen(transkey);

  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  if(compress) {
    error = zlib_compress(&compressed, &compressedsize,
                          (const unsigned char*)textstring, textsize, zlibsettings);
  }
  if(!error) {
    size_t size = keysize + 3 + langsize + 1 + transsize + 1 + (compress ? compressedsize : textsize);
    error = lodepng_chunk_init(&chunk, out, size, "iTXt");
  }
  if(!error) {
    size_t pos = 8;
    lodepng_memcpy(chunk + pos, keyword, keysize);
    pos += keysize;
    chunk[pos++] = 0; /*null termination char*/
    chunk[pos++] = (compress ? 1 : 0); /*compression flag*/
    chunk[pos++] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + pos, langtag, langsize);
    pos += langsize;
    chunk[pos++] = 0; /*null termination char*/
    lodepng_memcpy(chunk + pos, transkey, transsize);
    pos += transsize;
    chunk[pos++] = 0; /*null termination char*/
    if(compress) {
      lodepng_memcpy(chunk + pos, compressed, compressedsize);
    } else {
      lodepng_memcpy(chunk + pos, textstring, textsize);
    }
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}